

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall
choc::value::Value::addMember<choc::value::ValueView,char_const(&)[11],double&>
          (Value *this,string_view name,ValueView *v,char (*others) [11],double *others_1)

{
  string_view memberName;
  Type *other;
  string_view local_b8;
  ValueView local_a8;
  Type local_68;
  Value *local_48;
  char *pcStack_40;
  double *local_38;
  double *others_local_1;
  char (*others_local) [11];
  ValueView *v_local;
  Value *this_local;
  string_view name_local;
  
  pcStack_40 = name._M_str;
  local_48 = (Value *)name._M_len;
  local_38 = others_1;
  others_local_1 = (double *)others;
  others_local = (char (*) [11])v;
  v_local = (ValueView *)this;
  this_local = local_48;
  name_local._M_len = (size_t)pcStack_40;
  other = ValueView::getType(v);
  Type::Type(&local_68,other);
  memberName._M_str = pcStack_40;
  memberName._M_len = (size_t)local_48;
  Type::addObjectMember(&(this->value).type,memberName,&local_68);
  Type::~Type(&local_68);
  ValueView::ValueView(&local_a8,v);
  appendValue(this,&local_a8);
  ValueView::~ValueView(&local_a8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b8,(char *)others_local_1);
  addMember<double>(this,local_b8,*local_38);
  return;
}

Assistant:

void Value::addMember (std::string_view name, MemberType v, Others&&... others)
{
    static_assert ((sizeof...(others) & 1) == 0, "The arguments must be a sequence of name, value pairs");

    static_assert (isPrimitiveType<MemberType>() || isStringType<MemberType>() || isValueType<MemberType>(),
                   "The template type needs to be one of the supported primitive types");

    if constexpr (isValueType<MemberType>())
    {
        value.type.addObjectMember (name, v.getType());
        appendValue (v);
    }
    else if constexpr (isStringType<MemberType>())
    {
        auto stringHandle = dictionary.getHandleForString (v);
        appendMember (name, Type::createString(), std::addressof (stringHandle.handle), sizeof (stringHandle.handle));
    }
    else if constexpr (matchesType<MemberType, int32_t>())   { appendMember (name, Type::createInt32(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, int64_t>())   { appendMember (name, Type::createInt64(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, float>())     { appendMember (name, Type::createFloat32(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, double>())    { appendMember (name, Type::createFloat64(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, bool>())      { uint8_t b = v ? 1 : 0; appendMember (name, Type::createBool(), std::addressof (b), sizeof (b)); }

    if constexpr (sizeof...(others) != 0)
        addMember (std::forward<Others> (others)...);
}